

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O3

int wabt::OptionParser::Match(char *s,string *full,bool has_argument)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  
  pcVar1 = (full->_M_dataplus)._M_p;
  cVar4 = *pcVar1;
  if (cVar4 == '\0') {
    iVar2 = 0;
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    do {
      if (s[lVar3] == '\0') {
        return (int)lVar3;
      }
      if (s[lVar3] != cVar4) {
        return -1;
      }
      cVar4 = pcVar1[lVar3 + 1];
      lVar3 = lVar3 + 1;
    } while (cVar4 != '\0');
    iVar2 = (int)lVar3;
  }
  if (s[lVar3] != '\0') {
    if (!has_argument) {
      iVar2 = -1;
    }
    if (s[lVar3] != '=') {
      iVar2 = -1;
    }
    return iVar2;
  }
  return iVar2 + 1;
}

Assistant:

int OptionParser::Match(const char* s,
                        const std::string& full,
                        bool has_argument) {
  int i;
  for (i = 0;; i++) {
    if (full[i] == '\0') {
      // Perfect match. Return +1, so it will be preferred over a longer option
      // with the same prefix.
      if (s[i] == '\0') {
        return i + 1;
      }

      // We want to fail if s is longer than full, e.g. --foobar vs. --foo.
      // However, if s ends with an '=', it's OK.
      if (!(has_argument && s[i] == '=')) {
        return -1;
      }
      break;
    }
    if (s[i] == '\0') {
      break;
    }
    if (s[i] != full[i]) {
      return -1;
    }
  }
  return i;
}